

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeTest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int i)

{
  bool bVar1;
  Status *pSVar2;
  cpp_dec_float<50U,_int,_void> *pcVar3;
  long in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  Status in_stack_00000038;
  int in_stack_0000003c;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000040;
  Status stat;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffff38;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff40;
  undefined1 local_9c [56];
  undefined4 local_64;
  Status local_60;
  undefined4 *local_48;
  cpp_dec_float<50U,_int,_void> *local_40;
  cpp_dec_float<50U,_int,_void> *local_38;
  cpp_dec_float<50U,_int,_void> *local_28;
  undefined1 *local_18;
  cpp_dec_float<50U,_int,_void> *local_10;
  undefined4 *local_8;
  
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::desc((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)(in_RSI + 0x1f0));
  pSVar2 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::Desc::status((Desc *)in_stack_ffffffffffffff40,
                          (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  local_60 = *pSVar2;
  bVar1 = isBasic(in_stack_ffffffffffffff40,(Status)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  if (bVar1) {
    local_64 = 0;
    pcVar3 = &VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_ffffffffffffff40,
                           (int)((ulong)in_stack_ffffffffffffff38 >> 0x20))->m_backend;
    local_48 = &local_64;
    local_40 = pcVar3;
    local_8 = local_48;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (pcVar3,(long_long_type)in_stack_ffffffffffffff38);
    local_38 = pcVar3;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (pcVar3,in_stack_ffffffffffffff38);
  }
  else {
    test(in_stack_00000040,in_stack_0000003c,in_stack_00000038);
    pcVar3 = &VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_ffffffffffffff40,
                           (int)((ulong)in_stack_ffffffffffffff38 >> 0x20))->m_backend;
    local_18 = local_9c;
    local_10 = pcVar3;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffff40,pcVar3);
    local_28 = pcVar3;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffff40,pcVar3);
  }
  return in_RDI;
}

Assistant:

R SPxSolverBase<R>::computeTest(int i)
{
   typename SPxBasisBase<R>::Desc::Status stat = this->desc().status(i);

   if(isBasic(stat))
      return theTest[i] = 0;
   else
      return theTest[i] = test(i, stat);
}